

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O0

bool __thiscall
hwnet::TCPConnector::Connect(TCPConnector *this,ConnectCallback *connectFn,ErrorCallback *errorFn)

{
  Poller *this_00;
  bool bVar1;
  int iVar2;
  socklen_t __len;
  sockaddr *__addr;
  int *piVar3;
  enable_shared_from_this<hwnet::TCPConnector> local_58;
  shared_ptr<hwnet::Channel> local_48;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> guard;
  int ret;
  bool expected;
  ErrorCallback *errorFn_local;
  ConnectCallback *connectFn_local;
  TCPConnector *this_local;
  
  guard._M_device._7_1_ = 0;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    (&this->started,(bool *)((long)&guard._M_device + 7),true,memory_order_seq_cst);
  if (bVar1) {
    std::function<void_(int)>::operator=(&this->connectCallback_,connectFn);
    std::function<void_(int,_const_hwnet::Addr_&)>::operator=(&this->errorCallback_,errorFn);
    bVar1 = std::function::operator_cast_to_bool((function *)&this->connectCallback_);
    if (bVar1) {
      bVar1 = Addr::IsVaild(&this->remoteAddr);
      if (bVar1) {
        iVar2 = Addr::Family(&this->remoteAddr);
        iVar2 = socket(iVar2,1,6);
        this->fd = iVar2;
        if (this->fd < 0) {
          this_local._7_1_ = false;
        }
        else {
          SetNoBlock(this->fd,true);
          SetCloseOnExec(this->fd);
          iVar2 = this->fd;
          __addr = Addr::Address(&this->remoteAddr);
          __len = Addr::AddrLen(&this->remoteAddr);
          guard._M_device._0_4_ = connect(iVar2,(sockaddr *)__addr,__len);
          if (((int)guard._M_device != 0) && (piVar3 = __errno_location(), *piVar3 != 0x73)) {
            close(this->fd);
            this->fd = -1;
            return false;
          }
          std::lock_guard<std::mutex>::lock_guard(&local_38,&this->mtx);
          this_00 = this->poller_;
          std::enable_shared_from_this<hwnet::TCPConnector>::shared_from_this(&local_58);
          std::shared_ptr<hwnet::Channel>::shared_ptr<hwnet::TCPConnector,void>
                    (&local_48,(shared_ptr<hwnet::TCPConnector> *)&local_58);
          Poller::Add(this_00,&local_48,4);
          std::shared_ptr<hwnet::Channel>::~shared_ptr(&local_48);
          std::shared_ptr<hwnet::TCPConnector>::~shared_ptr
                    ((shared_ptr<hwnet::TCPConnector> *)&local_58);
          this_local._7_1_ = true;
          std::lock_guard<std::mutex>::~lock_guard(&local_38);
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TCPConnector::Connect(const ConnectCallback &connectFn,const ErrorCallback &errorFn) {

	bool expected = false;
	if(!this->started.compare_exchange_strong(expected,true)) {
		return false;
	}

	this->connectCallback_ = connectFn;
	this->errorCallback_ = errorFn;


	if(!this->connectCallback_) {
		return false;
	}

	if(!this->remoteAddr.IsVaild()) {
		return false;
	}

	this->fd = ::socket(this->remoteAddr.Family(),SOCK_STREAM,IPPROTO_TCP);
		
	if(this->fd < 0){
		return false;
	}

	SetNoBlock(this->fd,true);

	SetCloseOnExec(this->fd);

    int ret = ::connect(this->fd,this->remoteAddr.Address(),this->remoteAddr.AddrLen());

    if(ret == 0 || errno == EINPROGRESS) {
		std::lock_guard<std::mutex> guard(this->mtx);
    	this->poller_->Add(shared_from_this(),Poller::Write);
    	return true;
    } else {
    	::close(this->fd);
    	this->fd = -1;
    	return false;
    }
}